

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc-posix.c
# Opt level: O3

int mi_dupenv_s(char **buf,size_t *size,char *name)

{
  int iVar1;
  char *s;
  char *pcVar2;
  size_t sVar3;
  
  iVar1 = 0x16;
  if (name != (char *)0x0 && buf != (char **)0x0) {
    if (size != (size_t *)0x0) {
      *size = 0;
    }
    s = getenv(name);
    if (s == (char *)0x0) {
      *buf = (char *)0x0;
    }
    else {
      pcVar2 = mi_strdup(s);
      *buf = pcVar2;
      iVar1 = 0xc;
      if (pcVar2 != (char *)0x0) {
        iVar1 = 0;
      }
      if (pcVar2 == (char *)0x0 || size == (size_t *)0x0) {
        return iVar1;
      }
      sVar3 = _mi_strlen(s);
      *size = sVar3;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int mi_dupenv_s(char** buf, size_t* size, const char* name) mi_attr_noexcept {
  if (buf==NULL || name==NULL) return EINVAL;
  if (size != NULL) *size = 0;
  char* p = getenv(name);        // mscver warning 4996
  if (p==NULL) {
    *buf = NULL;
  }
  else {
    *buf = mi_strdup(p);
    if (*buf==NULL) return ENOMEM;
    if (size != NULL) *size = _mi_strlen(p);
  }
  return 0;
}